

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3EvalAllocateReaders(Fts3Cursor *pCsr,Fts3Expr *pExpr,int *pnToken,int *pnOr,int *pRc)

{
  int iVar1;
  int *in_RCX;
  Fts3Expr *in_RDX;
  Fts3Cursor *in_RSI;
  Fts3MultiSegReader **in_RDI;
  int *in_R8;
  int unaff_retaddr;
  int unaff_retaddr_00;
  char *in_stack_00000008;
  int rc;
  Fts3PhraseToken *pToken;
  int nToken;
  int i;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar2;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar3;
  
  if ((in_RSI != (Fts3Cursor *)0x0) && (*in_R8 == 0)) {
    if (*(int *)&(in_RSI->base).pVtab == 5) {
      iVar2 = *(int *)(*(long *)&in_RSI->iLangid + 0x50);
      in_RDX->eType = iVar2 + in_RDX->eType;
      for (iVar3 = 0; iVar3 < iVar2; iVar3 = iVar3 + 1) {
        iVar1 = fts3TermSegReaderCursor
                          ((Fts3Cursor *)pToken,in_stack_00000008,unaff_retaddr_00,unaff_retaddr,
                           in_RDI);
        if (iVar1 != 0) {
          *in_R8 = iVar1;
          return;
        }
      }
      *(undefined4 *)(*(long *)&in_RSI->iLangid + 0x3c) = 0xffffffff;
    }
    else {
      *in_RCX = (uint)(*(int *)&(in_RSI->base).pVtab == 4) + *in_RCX;
      fts3EvalAllocateReaders
                (in_RSI,in_RDX,in_RCX,in_R8,
                 (int *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      fts3EvalAllocateReaders
                (in_RSI,in_RDX,in_RCX,in_R8,
                 (int *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    }
  }
  return;
}

Assistant:

static void fts3EvalAllocateReaders(
  Fts3Cursor *pCsr,               /* FTS cursor handle */
  Fts3Expr *pExpr,                /* Allocate readers for this expression */
  int *pnToken,                   /* OUT: Total number of tokens in phrase. */
  int *pnOr,                      /* OUT: Total number of OR nodes in expr. */
  int *pRc                        /* IN/OUT: Error code */
){
  if( pExpr && SQLITE_OK==*pRc ){
    if( pExpr->eType==FTSQUERY_PHRASE ){
      int i;
      int nToken = pExpr->pPhrase->nToken;
      *pnToken += nToken;
      for(i=0; i<nToken; i++){
        Fts3PhraseToken *pToken = &pExpr->pPhrase->aToken[i];
        int rc = fts3TermSegReaderCursor(pCsr,
            pToken->z, pToken->n, pToken->isPrefix, &pToken->pSegcsr
        );
        if( rc!=SQLITE_OK ){
          *pRc = rc;
          return;
        }
      }
      assert( pExpr->pPhrase->iDoclistToken==0 );
      pExpr->pPhrase->iDoclistToken = -1;
    }else{
      *pnOr += (pExpr->eType==FTSQUERY_OR);
      fts3EvalAllocateReaders(pCsr, pExpr->pLeft, pnToken, pnOr, pRc);
      fts3EvalAllocateReaders(pCsr, pExpr->pRight, pnToken, pnOr, pRc);
    }
  }
}